

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndCriteria.cpp
# Opt level: O0

bool __thiscall
QuantLib::EndCriteria::operator()
          (EndCriteria *this,size_t iteration,size_t *statStateIterations,bool positiveOptimization,
          RealType fold,RealType param_6,RealType fnew,RealType normgnew,Type *ecType)

{
  bool bVar1;
  byte in_CL;
  size_t *in_RDX;
  size_t in_RSI;
  EndCriteria *in_RDI;
  Type *in_R8;
  RealType in_XMM0_Qa;
  RealType in_XMM2_Qa;
  RealType in_XMM3_Qa;
  undefined1 local_49;
  
  bVar1 = checkMaxIterations(in_RDI,in_RSI,in_R8);
  local_49 = true;
  if (!bVar1) {
    bVar1 = checkStationaryFunctionValue(in_RDI,in_XMM0_Qa,in_XMM2_Qa,in_RDX,in_R8);
    local_49 = true;
    if (!bVar1) {
      bVar1 = checkStationaryFunctionAccuracy(in_RDI,in_XMM2_Qa,(bool)(in_CL & 1),in_R8);
      local_49 = true;
      if (!bVar1) {
        local_49 = checkZeroGradientNorm(in_RDI,in_XMM3_Qa,in_R8);
      }
    }
  }
  return local_49;
}

Assistant:

bool EndCriteria::operator()(const size_t iteration,
                               size_t& statStateIterations,
                               const bool positiveOptimization,
                               const RealType fold,
                               const RealType,  // normgold,
                               const RealType fnew, const RealType normgnew,
                               EndCriteria::Type& ecType) const {
    return checkMaxIterations(iteration, ecType) ||
           checkStationaryFunctionValue(fold, fnew, statStateIterations,
                                        ecType) ||
           checkStationaryFunctionAccuracy(fnew, positiveOptimization,
                                           ecType) ||
           checkZeroGradientNorm(normgnew, ecType);
  }